

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O0

AABox * __thiscall Triangle::boundingVolume(AABox *__return_storage_ptr__,Triangle *this)

{
  float *pfVar1;
  AABox *v;
  Triangle *this_local;
  
  AABox::AABox(__return_storage_ptr__);
  pfVar1 = std::min<float>(&(this->v2).x,&(this->v3).x);
  pfVar1 = std::min<float>(&(this->v1).x,pfVar1);
  __return_storage_ptr__->x1 = *pfVar1;
  pfVar1 = std::max<float>(&(this->v2).x,&(this->v3).x);
  pfVar1 = std::max<float>(&(this->v1).x,pfVar1);
  __return_storage_ptr__->x2 = *pfVar1;
  pfVar1 = std::min<float>(&(this->v2).y,&(this->v3).y);
  pfVar1 = std::min<float>(&(this->v1).y,pfVar1);
  __return_storage_ptr__->y1 = *pfVar1;
  pfVar1 = std::max<float>(&(this->v2).y,&(this->v3).y);
  pfVar1 = std::max<float>(&(this->v1).y,pfVar1);
  __return_storage_ptr__->y2 = *pfVar1;
  pfVar1 = std::min<float>(&(this->v2).z,&(this->v3).z);
  pfVar1 = std::min<float>(&(this->v1).z,pfVar1);
  __return_storage_ptr__->z1 = *pfVar1;
  pfVar1 = std::max<float>(&(this->v2).z,&(this->v3).z);
  pfVar1 = std::max<float>(&(this->v1).z,pfVar1);
  __return_storage_ptr__->z2 = *pfVar1;
  return __return_storage_ptr__;
}

Assistant:

AABox boundingVolume() const
	{
		AABox v;
		v.x1 = std::min(v1.x, std::min(v2.x, v3.x));
		v.x2 = std::max(v1.x, std::max(v2.x, v3.x));
		v.y1 = std::min(v1.y, std::min(v2.y, v3.y));
		v.y2 = std::max(v1.y, std::max(v2.y, v3.y));
		v.z1 = std::min(v1.z, std::min(v2.z, v3.z));
		v.z2 = std::max(v1.z, std::max(v2.z, v3.z));
		return v;
	}